

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

int __thiscall Fl_Group::navigation(Fl_Group *this,int key)

{
  Fl_Widget *pFVar1;
  Fl_Widget *this_00;
  int iVar2;
  ulong uVar3;
  
  iVar2 = this->children_;
  if (iVar2 < 2) {
    return 0;
  }
  uVar3 = 0;
  while( true ) {
    if ((long)iVar2 <= (long)uVar3) {
      return 0;
    }
    iVar2 = Fl_Widget::contains(this->array_[uVar3],Fl::focus_);
    if (iVar2 != 0) break;
    uVar3 = uVar3 + 1;
    iVar2 = this->children_;
  }
  if (3 < key - 0xff51U) {
    return 0;
  }
  pFVar1 = this->array_[uVar3];
LAB_001ad764:
  do {
    iVar2 = (int)uVar3;
    if (key - 0xff53U < 2) {
      uVar3 = (ulong)(iVar2 + 1U);
      if ((this->children_ <= (int)(iVar2 + 1U)) &&
         (uVar3 = 0, (this->super_Fl_Widget).parent_ != (Fl_Group *)0x0)) {
        return 0;
      }
    }
    else {
      if (iVar2 == 0) {
        if ((this->super_Fl_Widget).parent_ != (Fl_Group *)0x0) {
          return 0;
        }
        iVar2 = this->children_;
      }
      uVar3 = (ulong)(iVar2 - 1);
    }
    this_00 = this->array_[(int)uVar3];
    if (this_00 == pFVar1) {
      return 0;
    }
    if (((char)key == 'T') || ((key & 0xffU) == 0x52)) {
      if ((pFVar1->w_ + pFVar1->x_ <= this_00->x_) || (this_00->x_ + this_00->w_ <= pFVar1->x_))
      goto LAB_001ad764;
    }
    iVar2 = Fl_Widget::take_focus(this_00);
    if (iVar2 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

void Fl_Group::end() {current_ = parent();}